

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

double __thiscall Util::RandomDouble(Util *this)

{
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_RDI;
  result_type_conflict1 rVar1;
  
  rVar1 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)this,in_RDI);
  return rVar1;
}

Assistant:

double Util::RandomDouble() {
    return random_double_(rng_);
}